

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTexture2Tests.cpp
# Opt level: O1

bool __thiscall
gl4cts::UncommittedRegionsAccessTestCase::verifyTextureDataExtended
          (UncommittedRegionsAccessTestCase *this,Functions *gl,GLint target,GLint format,
          GLuint *texture,GLint level,bool shaderOnly)

{
  undefined1 *this_00;
  pointer *__x;
  _Alloc_hider _Var1;
  undefined8 uVar2;
  GLint GVar3;
  GLint GVar4;
  pointer puVar5;
  pointer puVar6;
  pointer __s;
  GLenum GVar7;
  ostream *poVar8;
  size_t sVar9;
  TestError *this_01;
  int iVar10;
  undefined4 in_register_0000000c;
  deUint32 dVar11;
  long lVar12;
  Functions *pFVar13;
  SparseTexture2CommitmentTestCase *this_02;
  int iVar14;
  int iVar15;
  ulong uVar16;
  int iVar17;
  int iVar18;
  size_type sVar19;
  bool bVar20;
  bool bVar21;
  GLint depth;
  GLint width;
  GLint height;
  TransferFormat local_410;
  TextureFormat *local_408;
  GLuint verifyTexture;
  GLint local_3fc;
  UncommittedRegionsAccessTestCase *local_3f8;
  size_type local_3f0;
  Functions *local_3e8;
  ulong local_3e0;
  int local_3d4;
  ostream *local_3d0;
  string shader;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vecOutData;
  string local_388;
  string local_368;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vecExpData;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vecExpData_1;
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_288;
  undefined1 local_268 [32];
  TokenStrings s;
  ShaderProgram program;
  
  local_3e0 = CONCAT44(in_register_0000000c,format);
  this_00 = &(this->super_SparseTexture2CommitmentTestCase).super_SparseTextureCommitmentTestCase.
             field_0x88;
  local_3e8 = gl;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"Verify Texture [level: ",0x17);
  local_3d0 = (ostream *)this_00;
  poVar8 = (ostream *)std::ostream::operator<<(this_00,level);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"] - ",4);
  if ((this->super_SparseTexture2CommitmentTestCase).super_SparseTextureCommitmentTestCase.mState.
      levels + -1 < level) {
    this_01 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_01,"Invalid level",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
               ,0x676);
    __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  local_410 = glu::getTransferFormat
                        ((this->super_SparseTexture2CommitmentTestCase).
                         super_SparseTextureCommitmentTestCase.mState.format);
  local_3f0 = CONCAT44(local_3f0._4_4_,target);
  local_3fc = level;
  SparseTextureUtils::getTextureLevelSize
            (target,&(this->super_SparseTexture2CommitmentTestCase).
                     super_SparseTextureCommitmentTestCase.mState,level,&width,&height,&depth);
  GVar3 = depth;
  if (height == 0 || width + 1U < 3) {
    return true;
  }
  if (depth < (this->super_SparseTexture2CommitmentTestCase).super_SparseTextureCommitmentTestCase.
              mState.minDepth) {
    return true;
  }
  local_408 = &(this->super_SparseTexture2CommitmentTestCase).super_SparseTextureCommitmentTestCase.
               mState.format;
  local_3f8 = (UncommittedRegionsAccessTestCase *)((ulong)local_410 >> 0x20);
  iVar18 = width / 2;
  if ((((shaderOnly) || ((GLenum)local_3f0 == 0x8513)) || ((GLenum)local_3f0 == 0x9100)) ||
     ((GLenum)local_3f0 == 0x9102)) {
    local_3d4 = iVar18;
    if ((GLenum)local_3f0 != 0x8513 || shaderOnly) {
      if (!shaderOnly) {
        return true;
      }
      dVar11 = 0x8c1a;
      if ((GLenum)local_3f0 == 0x9100) {
        dVar11 = 0xde1;
      }
      local_410.format = dVar11;
      if ((GLenum)local_3f0 == 0x8513) {
        depth = depth * 6;
      }
      vecExpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      vecExpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      vecExpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      vecOutData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      vecOutData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      vecOutData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      sVar19 = (size_type)(height * width * depth);
      local_3f8 = this;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&vecExpData,sVar19);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&vecOutData,sVar19);
      puVar6 = vecExpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      puVar5 = vecOutData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      memset(vecExpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start,0xff,sVar19);
      pFVar13 = local_3e8;
      gl4cts::Texture::Generate(local_3e8,&verifyTexture);
      gl4cts::Texture::Bind(pFVar13,verifyTexture,local_410.format);
      gl4cts::Texture::Storage(pFVar13,local_410.format,1,0x8229,width,height,depth);
      GVar7 = (*pFVar13->getError)();
      glu::checkError(GVar7,"Texture::Storage",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                      ,0x6f6);
      if ((local_3f8->super_SparseTexture2CommitmentTestCase).super_SparseTextureCommitmentTestCase.
          mState.samples < 1) {
        bVar21 = true;
      }
      else {
        bVar21 = true;
        local_408 = (TextureFormat *)((ulong)local_408 & 0xffffffff00000000);
        do {
          memset(puVar5,0,sVar19);
          gl4cts::Texture::Bind(pFVar13,verifyTexture,local_410.format);
          gl4cts::Texture::SubImage
                    (pFVar13,local_410.format,0,0,0,0,width,height,depth,0x1903,0x1401,puVar5);
          GVar7 = (*pFVar13->getError)();
          glu::checkError(GVar7,"Texture::SubImage",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                          ,0x6ff);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&shader,st2_compute_textureVerify,(allocator<char> *)&s);
          local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_368,"image","");
          local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
          this_02 = (SparseTexture2CommitmentTestCase *)0x1be54c4;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_388,"image","");
          SparseTexture2CommitmentTestCase::createShaderTokens
                    (&s,this_02,(GLenum)local_3f0,(GLint)local_3e0,(GLint)local_408,&local_368,
                     &local_388);
          pFVar13 = local_3e8;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_388._M_dataplus._M_p != &local_388.field_2) {
            operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_368._M_dataplus._M_p != &local_368.field_2) {
            operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
          }
          replaceToken("<OUTPUT_TYPE>",s.outputType._M_dataplus._M_p,&shader);
          replaceToken("<FORMAT>",s.format._M_dataplus._M_p,&shader);
          replaceToken("<INPUT_TYPE>",s.inputType._M_dataplus._M_p,&shader);
          replaceToken("<POINT_TYPE>",s.pointType._M_dataplus._M_p,&shader);
          replaceToken("<POINT_DEF>",s.pointDef._M_dataplus._M_p,&shader);
          replaceToken("<RETURN_TYPE>",s.returnType._M_dataplus._M_p,&shader);
          replaceToken("<SAMPLE_DEF>",s.sampleDef._M_dataplus._M_p,&shader);
          replaceToken("<RESULT_EXPECTED>",s.resultDefault._M_dataplus._M_p,&shader);
          replaceToken("<EPSILON>",s.epsilon._M_dataplus._M_p,&shader);
          local_268[0x10] = 0;
          local_268._17_8_ = 0;
          local_268._0_8_ = (pointer)0x0;
          local_268[8] = 0;
          local_268._9_7_ = 0;
          memset(&vecExpData_1,0,0xac);
          program.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
          _M_impl.super__Vector_impl_data._M_start =
               (pointer)CONCAT44(program.m_shaders[0].
                                 super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
                                 _M_impl.super__Vector_impl_data._M_start._4_4_,5);
          program.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)(program.m_shaders + 1);
          __x = &program.m_shaders[0].
                 super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                 super__Vector_impl_data._M_finish;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)__x,shader._M_dataplus._M_p,
                     shader._M_dataplus._M_p + shader._M_string_length);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)(&vecExpData_1 +
                         ((ulong)program.m_shaders[0].
                                 super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
                                 _M_impl.super__Vector_impl_data._M_start & 0xffffffff)),
                      (value_type *)__x);
          if ((vector<glu::Shader_*,_std::allocator<glu::Shader_*>_> *)
              program.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
              ._M_impl.super__Vector_impl_data._M_finish != program.m_shaders + 1) {
            operator_delete(program.m_shaders[0].
                            super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish,
                            (long)program.m_shaders[1].
                                  super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
                                  _M_impl.super__Vector_impl_data._M_start + 1);
          }
          glu::ShaderProgram::ShaderProgram
                    (&program,((local_3f8->super_SparseTexture2CommitmentTestCase).
                               super_SparseTextureCommitmentTestCase.super_TestCase.m_context)->
                              m_renderCtx,(ProgramSources *)&vecExpData_1);
          if (program.m_program.m_info.linkOk == true) {
            (*pFVar13->useProgram)(program.m_program.m_program);
            GVar7 = (*pFVar13->getError)();
            glu::checkError(GVar7,"glUseProgram",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                            ,0x718);
            (*pFVar13->bindImageTexture)(0,verifyTexture,0,'\0',0,0x88b9,0x8232);
            GVar7 = (*pFVar13->getError)();
            glu::checkError(GVar7,"glBindImageTexture",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                            ,0x71f);
            (*pFVar13->bindImageTexture)(1,*texture,local_3fc,'\0',0,35000,(GLenum)local_3e0);
            GVar7 = (*pFVar13->getError)();
            glu::checkError(GVar7,"glBindImageTexture",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                            ,0x726);
            (*pFVar13->uniform1i)(1,0);
            GVar7 = (*pFVar13->getError)();
            glu::checkError(GVar7,"glUniform1i",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                            ,0x728);
            (*pFVar13->uniform1i)(2,1);
            GVar7 = (*pFVar13->getError)();
            glu::checkError(GVar7,"glUniform1i",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                            ,0x72a);
            (*pFVar13->dispatchCompute)(width,height,depth);
            GVar7 = (*pFVar13->getError)();
            glu::checkError(GVar7,"glDispatchCompute",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                            ,0x72c);
            (*pFVar13->memoryBarrier)(0xffffffff);
            GVar7 = (*pFVar13->getError)();
            glu::checkError(GVar7,"glMemoryBarrier",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                            ,0x72e);
            gl4cts::Texture::GetData(pFVar13,0,local_410.format,0x1903,0x1401,puVar5);
            GVar7 = (*pFVar13->getError)();
            glu::checkError(GVar7,"Texture::GetData",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                            ,0x731);
            if (local_3d4 < width) {
              iVar18 = local_3d4;
              do {
                if (0 < height) {
                  iVar14 = 0;
                  iVar15 = iVar18;
                  do {
                    uVar16 = (ulong)(uint)depth;
                    iVar17 = iVar15;
                    if (0 < depth) {
                      do {
                        if (puVar6[iVar17] != puVar5[iVar17]) {
                          bVar21 = false;
                        }
                        iVar17 = iVar17 + height * width;
                        uVar16 = uVar16 - 1;
                      } while (uVar16 != 0);
                    }
                    iVar14 = iVar14 + 1;
                    iVar15 = iVar15 + width;
                  } while (iVar14 != height);
                }
                iVar18 = iVar18 + 1;
              } while (iVar18 != width);
            }
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>
                      (local_3d0,"Compute shader compilation failed (reading) for target: ",0x38);
            poVar8 = (ostream *)std::ostream::operator<<(local_3d0,(GLenum)local_3f0);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,", format: ",10);
            poVar8 = (ostream *)std::ostream::operator<<(poVar8,(int)local_3e0);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,", sample: ",10);
            poVar8 = (ostream *)std::ostream::operator<<(poVar8,(GLint)local_408);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,", infoLog: ",0xb);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar8,((*program.m_shaders[5].
                                          super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->m_info).
                                       infoLog._M_dataplus._M_p,
                                ((*program.m_shaders[5].
                                   super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->m_info).infoLog.
                                _M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,", shaderSource: ",0x10);
            _Var1 = shader._M_dataplus;
            if (shader._M_dataplus._M_p == (pointer)0x0) {
              std::ios::clear((int)poVar8 + (int)poVar8->_vptr_basic_ostream[-3]);
            }
            else {
              sVar9 = strlen(shader._M_dataplus._M_p);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8,_Var1._M_p,sVar9);
            }
            std::__ostream_insert<char,std::char_traits<char>>(poVar8," - ",3);
            bVar21 = false;
          }
          glu::ShaderProgram::~ShaderProgram(&program);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_268);
          std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::
          ~vector(&local_288);
          lVar12 = 0x78;
          do {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)((long)&vecExpData_1.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start + lVar12));
            lVar12 = lVar12 + -0x18;
          } while (lVar12 != -0x18);
          SparseTexture2CommitmentTestCase::TokenStrings::~TokenStrings(&s);
          pFVar13 = local_3e8;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)shader._M_dataplus._M_p != &shader.field_2) {
            operator_delete(shader._M_dataplus._M_p,shader.field_2._M_allocated_capacity + 1);
          }
          iVar18 = (GLint)local_408 + 1;
          local_408 = (TextureFormat *)CONCAT44(local_408._4_4_,iVar18);
        } while (iVar18 < (local_3f8->super_SparseTexture2CommitmentTestCase).
                          super_SparseTextureCommitmentTestCase.mState.samples);
      }
      gl4cts::Texture::Delete(pFVar13,&verifyTexture);
      _Var1._M_p = (pointer)vecExpData.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start;
      uVar2 = vecExpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
      if (vecOutData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(vecOutData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)vecOutData.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)vecOutData.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
        _Var1._M_p = (pointer)vecExpData.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start;
        uVar2 = vecExpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage;
      }
      goto joined_r0x00a6a2a1;
    }
    s.format._M_dataplus._M_p = (pointer)0x0;
    s.format._M_string_length = 0;
    s.format.field_2._M_allocated_capacity = 0;
    vecExpData_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(vecExpData_1.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start._4_4_,0x8515);
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              ((vector<int,_std::allocator<int>_> *)&s,(iterator)0x0,(int *)&vecExpData_1);
    vecExpData_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(vecExpData_1.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start._4_4_,0x8516);
    if (s.format._M_string_length == s.format.field_2._M_allocated_capacity) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                ((vector<int,_std::allocator<int>_> *)&s,(iterator)s.format._M_string_length,
                 (int *)&vecExpData_1);
    }
    else {
      *(undefined4 *)s.format._M_string_length = 0x8516;
      s.format._M_string_length = s.format._M_string_length + 4;
    }
    vecExpData_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(vecExpData_1.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start._4_4_,0x8517);
    if (s.format._M_string_length == s.format.field_2._M_allocated_capacity) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                ((vector<int,_std::allocator<int>_> *)&s,(iterator)s.format._M_string_length,
                 (int *)&vecExpData_1);
    }
    else {
      *(undefined4 *)s.format._M_string_length = 0x8517;
      s.format._M_string_length = s.format._M_string_length + 4;
    }
    vecExpData_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(vecExpData_1.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start._4_4_,0x8518);
    if (s.format._M_string_length == s.format.field_2._M_allocated_capacity) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                ((vector<int,_std::allocator<int>_> *)&s,(iterator)s.format._M_string_length,
                 (int *)&vecExpData_1);
    }
    else {
      *(undefined4 *)s.format._M_string_length = 0x8518;
      s.format._M_string_length = s.format._M_string_length + 4;
    }
    vecExpData_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(vecExpData_1.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start._4_4_,0x8519);
    if (s.format._M_string_length == s.format.field_2._M_allocated_capacity) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                ((vector<int,_std::allocator<int>_> *)&s,(iterator)s.format._M_string_length,
                 (int *)&vecExpData_1);
    }
    else {
      *(undefined4 *)s.format._M_string_length = 0x8519;
      s.format._M_string_length = s.format._M_string_length + 4;
    }
    vecExpData_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(vecExpData_1.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start._4_4_,0x851a);
    if (s.format._M_string_length == s.format.field_2._M_allocated_capacity) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                ((vector<int,_std::allocator<int>_> *)&s,(iterator)s.format._M_string_length,
                 (int *)&vecExpData_1);
    }
    else {
      *(undefined4 *)s.format._M_string_length = 0x851a;
      s.format._M_string_length = s.format._M_string_length + 4;
    }
    GVar4 = height;
    GVar3 = width;
    iVar15 = tcu::TextureFormat::getPixelSize(local_408);
    vecExpData_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    vecExpData_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    vecExpData_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    program.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    program.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    program.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    sVar19 = (size_type)(GVar4 * GVar3 * iVar15);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&vecExpData_1,sVar19);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&program,sVar19);
    __s = program.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
          _M_impl.super__Vector_impl_data._M_start;
    puVar5 = vecExpData_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    memset(vecExpData_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start,0xff,sVar19);
    if ((pointer)s.format._M_string_length == s.format._M_dataplus._M_p) {
      bVar21 = true;
    }
    else {
      bVar21 = true;
      uVar16 = 0;
      local_3f0 = sVar19;
      do {
        pFVar13 = local_3e8;
        GVar7 = *(GLenum *)(s.format._M_dataplus._M_p + uVar16 * 4);
        local_3e0 = uVar16;
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_3d0,"Verify Subtarget [subtarget: ",0x1d);
        poVar8 = (ostream *)std::ostream::operator<<(local_3d0,GVar7);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"] - ",4);
        memset(__s,0xff,local_3f0);
        gl4cts::Texture::GetData(pFVar13,local_3fc,GVar7,local_410.format,(GLenum)local_3f8,__s);
        GVar7 = (*pFVar13->getError)();
        glu::checkError(GVar7,"Texture::GetData",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                        ,0x6c7);
        if (iVar18 < width) {
          do {
            if (0 < height) {
              iVar15 = 0;
              do {
                if (0 < depth) {
                  iVar14 = 0;
                  do {
                    iVar17 = tcu::TextureFormat::getPixelSize(local_408);
                    lVar12 = (long)((width * iVar15 + iVar18) * iVar17);
                    iVar17 = bcmp(puVar5 + lVar12,(void *)(lVar12 + (long)__s),(long)iVar17);
                    if (iVar17 != 0) {
                      bVar21 = false;
                    }
                    iVar14 = iVar14 + 1;
                  } while (iVar14 < depth);
                }
                iVar15 = iVar15 + 1;
              } while (iVar15 < height);
            }
            iVar18 = iVar18 + 1;
          } while (iVar18 < width);
        }
      } while ((bVar21) &&
              (uVar16 = local_3e0 + 1, iVar18 = local_3d4,
              uVar16 < (ulong)((long)(s.format._M_string_length - (long)s.format._M_dataplus._M_p)
                              >> 2)));
    }
    if (program.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(program.m_shaders[0].
                      super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)program.m_shaders[0].
                            super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)program.m_shaders[0].
                            super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  else {
    iVar14 = height * width;
    iVar15 = tcu::TextureFormat::getPixelSize(local_408);
    s.format.field_2._M_allocated_capacity = 0;
    s.format._M_dataplus._M_p = (pointer)0x0;
    s.format._M_string_length = 0;
    vecExpData_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    vecExpData_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    vecExpData_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    sVar19 = (size_type)(GVar3 * iVar15 * iVar14);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&s,sVar19);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&vecExpData_1,sVar19);
    _Var1 = s.format._M_dataplus;
    puVar5 = vecExpData_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    memset(s.format._M_dataplus._M_p,0,sVar19);
    memset(puVar5,0xff,sVar19);
    pFVar13 = local_3e8;
    gl4cts::Texture::GetData
              (local_3e8,local_3fc,(GLenum)local_3f0,local_410.format,(GLenum)local_3f8,puVar5);
    GVar7 = (*pFVar13->getError)();
    glu::checkError(GVar7,"Texture::GetData",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                    ,0x699);
    bVar21 = true;
    if (iVar18 < width) {
      bVar20 = true;
      bVar21 = true;
      do {
        if (0 < height) {
          iVar15 = 0;
          do {
            if (0 < depth) {
              iVar14 = 0;
              bVar21 = bVar20;
              do {
                iVar17 = tcu::TextureFormat::getPixelSize(local_408);
                iVar10 = (width * iVar15 + iVar18) * iVar17;
                iVar17 = bcmp(_Var1._M_p + iVar10,puVar5 + iVar10,(long)iVar17);
                if (iVar17 != 0) {
                  bVar21 = false;
                }
                iVar14 = iVar14 + 1;
                bVar20 = bVar21;
              } while (iVar14 < depth);
            }
            iVar15 = iVar15 + 1;
          } while (iVar15 < height);
        }
        iVar18 = iVar18 + 1;
      } while (iVar18 < width);
    }
  }
  _Var1._M_p = s.format._M_dataplus._M_p;
  uVar2 = s.format.field_2._M_allocated_capacity;
  if (vecExpData_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(vecExpData_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)vecExpData_1.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)vecExpData_1.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
    _Var1 = s.format._M_dataplus;
    uVar2 = s.format.field_2._M_allocated_capacity;
  }
joined_r0x00a6a2a1:
  if ((pointer)_Var1._M_p != (pointer)0x0) {
    operator_delete(_Var1._M_p,uVar2 - (long)_Var1._M_p);
  }
  return bVar21;
}

Assistant:

bool UncommittedRegionsAccessTestCase::verifyTextureDataExtended(const Functions& gl, GLint target, GLint format,
																 GLuint& texture, GLint level, bool shaderOnly)
{
	mLog << "Verify Texture [level: " << level << "] - ";

	if (level > mState.levels - 1)
		TCU_FAIL("Invalid level");

	TransferFormat transferFormat = glu::getTransferFormat(mState.format);

	GLint width;
	GLint height;
	GLint depth;
	SparseTextureUtils::getTextureLevelSize(target, mState, level, width, height, depth);

	//Committed region is limited to 1/2 of width
	GLint widthCommitted = width / 2;

	if (widthCommitted == 0 || height == 0 || depth < mState.minDepth)
		return true;

	bool result = true;

	// Verify texture using API glGetTexImage* (Skip multisample textures as it can not be verified using API)
	if (!shaderOnly && target != GL_TEXTURE_CUBE_MAP && target != GL_TEXTURE_2D_MULTISAMPLE &&
		target != GL_TEXTURE_2D_MULTISAMPLE_ARRAY)
	{
		GLint texSize = width * height * depth * mState.format.getPixelSize();

		std::vector<GLubyte> vecExpData;
		std::vector<GLubyte> vecOutData;
		vecExpData.resize(texSize);
		vecOutData.resize(texSize);
		GLubyte* exp_data = vecExpData.data();
		GLubyte* out_data = vecOutData.data();

		// Expected value in this case is 0 because atomic operations result on uncommitted regions are zeros
		deMemset(exp_data, 0, texSize);
		deMemset(out_data, 255, texSize);

		Texture::GetData(gl, level, target, transferFormat.format, transferFormat.dataType, (GLvoid*)out_data);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Texture::GetData");

		//Verify only committed region
		for (GLint x = widthCommitted; x < width; ++x)
			for (GLint y = 0; y < height; ++y)
				for (GLint z = 0; z < depth; ++z)
				{
					int		 pixelSize	 = mState.format.getPixelSize();
					GLubyte* dataRegion	= exp_data + ((x + y * width) * pixelSize);
					GLubyte* outDataRegion = out_data + ((x + y * width) * pixelSize);
					if (deMemCmp(dataRegion, outDataRegion, pixelSize) != 0)
						result = false;
				}
	}
	// Verify texture using API glGetTexImage* (Only cube map as it has to be verified for subtargets)
	else if (!shaderOnly && target == GL_TEXTURE_CUBE_MAP)
	{
		std::vector<GLint> subTargets;

		subTargets.push_back(GL_TEXTURE_CUBE_MAP_POSITIVE_X);
		subTargets.push_back(GL_TEXTURE_CUBE_MAP_NEGATIVE_X);
		subTargets.push_back(GL_TEXTURE_CUBE_MAP_POSITIVE_Y);
		subTargets.push_back(GL_TEXTURE_CUBE_MAP_NEGATIVE_Y);
		subTargets.push_back(GL_TEXTURE_CUBE_MAP_POSITIVE_Z);
		subTargets.push_back(GL_TEXTURE_CUBE_MAP_NEGATIVE_Z);

		GLint texSize = width * height * mState.format.getPixelSize();

		std::vector<GLubyte> vecExpData;
		std::vector<GLubyte> vecOutData;
		vecExpData.resize(texSize);
		vecOutData.resize(texSize);
		GLubyte* exp_data = vecExpData.data();
		GLubyte* out_data = vecOutData.data();

		deMemset(exp_data, 255, texSize);

		for (size_t i = 0; i < subTargets.size(); ++i)
		{
			GLint subTarget = subTargets[i];

			mLog << "Verify Subtarget [subtarget: " << subTarget << "] - ";

			deMemset(out_data, 255, texSize);

			Texture::GetData(gl, level, subTarget, transferFormat.format, transferFormat.dataType, (GLvoid*)out_data);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Texture::GetData");

			//Verify only committed region
			for (GLint x = widthCommitted; x < width; ++x)
				for (GLint y = 0; y < height; ++y)
					for (GLint z = 0; z < depth; ++z)
					{
						int		 pixelSize	 = mState.format.getPixelSize();
						GLubyte* dataRegion	= exp_data + ((x + y * width) * pixelSize);
						GLubyte* outDataRegion = out_data + ((x + y * width) * pixelSize);
						if (deMemCmp(dataRegion, outDataRegion, pixelSize) != 0)
							result = false;
					}

			if (!result)
				break;
		}
	}
	// Verify texture using shader imageLoad function
	else if (shaderOnly)
	{
		// Create verifying texture
		GLint verifyTarget;
		if (target == GL_TEXTURE_2D_MULTISAMPLE)
			verifyTarget = GL_TEXTURE_2D;
		else
			verifyTarget = GL_TEXTURE_2D_ARRAY;

		if (target == GL_TEXTURE_CUBE_MAP)
			depth = depth * 6;

		GLint texSize = width * height * depth;

		std::vector<GLubyte> vecExpData;
		std::vector<GLubyte> vecOutData;
		vecExpData.resize(texSize);
		vecOutData.resize(texSize);
		GLubyte* exp_data = vecExpData.data();
		GLubyte* out_data = vecOutData.data();

		// Expected value in this case is 255 because shader fills output texture with 255 if in texture is filled with zeros
		deMemset(exp_data, 255, texSize);

		GLuint verifyTexture;
		Texture::Generate(gl, verifyTexture);
		Texture::Bind(gl, verifyTexture, verifyTarget);
		Texture::Storage(gl, verifyTarget, 1, GL_R8, width, height, depth);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Texture::Storage");

		for (GLint sample = 0; sample < mState.samples; ++sample)
		{
			deMemset(out_data, 0, texSize);

			Texture::Bind(gl, verifyTexture, verifyTarget);
			Texture::SubImage(gl, verifyTarget, 0, 0, 0, 0, width, height, depth, GL_RED, GL_UNSIGNED_BYTE,
							  (GLvoid*)out_data);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Texture::SubImage");

			std::string shader = st2_compute_textureVerify;

			// Adjust shader source to texture format
			TokenStrings s = createShaderTokens(target, format, sample);

			replaceToken("<OUTPUT_TYPE>", s.outputType.c_str(), shader);
			replaceToken("<FORMAT>", s.format.c_str(), shader);
			replaceToken("<INPUT_TYPE>", s.inputType.c_str(), shader);
			replaceToken("<POINT_TYPE>", s.pointType.c_str(), shader);
			replaceToken("<POINT_DEF>", s.pointDef.c_str(), shader);
			replaceToken("<RETURN_TYPE>", s.returnType.c_str(), shader);
			replaceToken("<SAMPLE_DEF>", s.sampleDef.c_str(), shader);
			replaceToken("<RESULT_EXPECTED>", s.resultDefault.c_str(), shader);
			replaceToken("<EPSILON>", s.epsilon.c_str(), shader);

			ProgramSources sources;
			sources << ComputeSource(shader);

			// Build and run shader
			ShaderProgram program(m_context.getRenderContext(), sources);
			if (program.isOk())
			{
				gl.useProgram(program.getProgram());
				GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram");
				gl.bindImageTexture(0, //unit
									verifyTexture,
									0,		  //level
									GL_FALSE, //layered
									0,		  //layer
									GL_WRITE_ONLY, GL_R8UI);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glBindImageTexture");
				gl.bindImageTexture(1, //unit
									texture,
									level,	//level
									GL_FALSE, //layered
									0,		  //layer
									GL_READ_ONLY, format);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glBindImageTexture");
				gl.uniform1i(1, 0 /* image_unit */);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform1i");
				gl.uniform1i(2, 1 /* image_unit */);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform1i");
				gl.dispatchCompute(width, height, depth);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glDispatchCompute");
				gl.memoryBarrier(GL_ALL_BARRIER_BITS);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glMemoryBarrier");

				Texture::GetData(gl, 0, verifyTarget, GL_RED, GL_UNSIGNED_BYTE, (GLvoid*)out_data);
				GLU_EXPECT_NO_ERROR(gl.getError(), "Texture::GetData");

				//Verify only committed region
				for (GLint x = widthCommitted; x < width; ++x)
					for (GLint y = 0; y < height; ++y)
						for (GLint z = 0; z < depth; ++z)
						{
							GLubyte* dataRegion	= exp_data + ((x + y * width) + z * width * height);
							GLubyte* outDataRegion = out_data + ((x + y * width) + z * width * height);
							if (dataRegion[0] != outDataRegion[0])
								result = false;
						}
			}
			else
			{
				mLog << "Compute shader compilation failed (reading) for target: " << target << ", format: " << format
					 << ", sample: " << sample << ", infoLog: " << program.getShaderInfo(SHADERTYPE_COMPUTE).infoLog
					 << ", shaderSource: " << shader.c_str() << " - ";

				result = false;
			}
		}

		Texture::Delete(gl, verifyTexture);
	}

	return result;
}